

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O0

bool hasValidNodes(Network *nw)

{
  bool bVar1;
  reference ppNVar2;
  ENerror *e;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  bool result;
  Network *nw_local;
  
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&nw->nodes);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&nw->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    (*((*ppNVar2)->super_Element)._vptr_Element[0xb])(*ppNVar2,nw);
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return true;
}

Assistant:

bool hasValidNodes(Network* nw)
{
    bool result = true;
    for (Node* node : nw->nodes )
    {
        try
        {
            node->validate(nw);
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }
    }
    return result;
}